

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  bool bVar1;
  uint uVar2;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *this_00;
  reference this_01;
  pointer pcVar3;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *generator;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range1;
  cmInstallSubdirectoryGenerator *this_local;
  
  this_00 = cmMakefile::GetInstallGenerators(this->Makefile);
  __end1 = std::
           vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ::begin(this_00);
  generator = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
              std::
              vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                                *)&generator);
    if (!bVar1) {
      return false;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
              ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
             operator->(this_01);
    uVar2 = (*(pcVar3->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (const auto& generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}